

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ManSortPairsInt(word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnatePairs,
                        Vec_Int_t *vUnatePairsW,Vec_Wec_t *vSorter)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  
  uVar10 = nWords * 0x40;
  iVar9 = vSorter->nCap;
  if (iVar9 < (int)uVar10) {
    if (vSorter->pArray == (Vec_Int_t *)0x0) {
      pVVar6 = (Vec_Int_t *)malloc((long)(int)uVar10 << 4);
    }
    else {
      pVVar6 = (Vec_Int_t *)realloc(vSorter->pArray,(long)(int)uVar10 << 4);
      iVar9 = vSorter->nCap;
    }
    vSorter->pArray = pVVar6;
    memset(pVVar6 + iVar9,0,(long)(int)(uVar10 - iVar9) << 4);
    vSorter->nCap = uVar10;
  }
  vSorter->nSize = uVar10;
  if (0 < vUnatePairs->nSize) {
    uVar15 = (ulong)(uint)nWords;
    lVar7 = 0;
    do {
      uVar10 = vUnatePairs->pArray[lVar7];
      if ((int)uVar10 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      uVar13 = uVar10 >> 1 & 0x7fff;
      uVar5 = uVar13 >> 1;
      if ((vDivs->nSize <= (int)uVar5) || ((uint)vDivs->nSize <= uVar10 >> 0x11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = vDivs->pArray[uVar5];
      pvVar2 = vDivs->pArray[uVar10 >> 0x11];
      if (uVar13 < uVar10 >> 0x10) {
        if ((uVar10 & 1) != 0) {
          __assert_fail("!fComp",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                        ,0x3ed,
                        "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                       );
        }
        uVar5 = uVar10 >> 1 & 1;
        uVar13 = uVar10 >> 0x10 & 1;
        if (uVar13 == 0 && uVar5 == 0) {
          if (nWords < 1) goto LAB_0079f0d9;
          uVar8 = 0;
          uVar5 = 0;
          do {
            uVar14 = *(ulong *)((long)pvVar1 + uVar8 * 8) & pOn[uVar8] &
                     *(ulong *)((long)pvVar2 + uVar8 * 8);
            uVar14 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
            uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
            uVar14 = (uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f;
            uVar14 = (uVar14 >> 8) + uVar14;
            lVar12 = (uVar14 >> 0x10) + uVar14;
            uVar5 = uVar5 + ((int)((ulong)lVar12 >> 0x20) + (int)lVar12 & 0xffU);
            uVar8 = uVar8 + 1;
          } while (uVar15 != uVar8);
        }
        else {
          bVar11 = (byte)uVar13;
          if (uVar5 == 0 || bVar11 != 0) {
            if ((uVar5 == 0 & bVar11) == 0) {
              if (nWords < 1) goto LAB_0079f0d9;
              uVar8 = 0;
              uVar5 = 0;
              do {
                uVar14 = ~(*(ulong *)((long)pvVar2 + uVar8 * 8) |
                          *(ulong *)((long)pvVar1 + uVar8 * 8)) & pOn[uVar8];
                uVar14 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
                uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
                uVar14 = (uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f;
                uVar14 = (uVar14 >> 8) + uVar14;
                lVar12 = (uVar14 >> 0x10) + uVar14;
                uVar5 = uVar5 + ((int)((ulong)lVar12 >> 0x20) + (int)lVar12 & 0xffU);
                uVar8 = uVar8 + 1;
              } while (uVar15 != uVar8);
            }
            else {
              if (nWords < 1) goto LAB_0079f0d9;
              uVar8 = 0;
              uVar5 = 0;
              do {
                uVar14 = ~*(ulong *)((long)pvVar2 + uVar8 * 8) &
                         *(ulong *)((long)pvVar1 + uVar8 * 8) & pOn[uVar8];
                uVar14 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
                uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
                uVar14 = (uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f;
                uVar14 = (uVar14 >> 8) + uVar14;
                lVar12 = (uVar14 >> 0x10) + uVar14;
                uVar5 = uVar5 + ((int)((ulong)lVar12 >> 0x20) + (int)lVar12 & 0xffU);
                uVar8 = uVar8 + 1;
              } while (uVar15 != uVar8);
            }
          }
          else {
            if (nWords < 1) goto LAB_0079f0d9;
            uVar8 = 0;
            uVar5 = 0;
            do {
              uVar14 = ~*(ulong *)((long)pvVar1 + uVar8 * 8) & pOn[uVar8] &
                       *(ulong *)((long)pvVar2 + uVar8 * 8);
              uVar14 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
              uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
              uVar14 = (uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f;
              uVar14 = (uVar14 >> 8) + uVar14;
              lVar12 = (uVar14 >> 0x10) + uVar14;
              uVar5 = uVar5 + ((int)((ulong)lVar12 >> 0x20) + (int)lVar12 & 0xffU);
              uVar8 = uVar8 + 1;
            } while (uVar15 != uVar8);
          }
        }
      }
      else {
        if ((uVar10 & 2) != 0) {
          __assert_fail("!Abc_LitIsCompl(iLit0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                        ,0x3f3,
                        "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                       );
        }
        if ((uVar10 >> 0x10 & 1) != 0) {
          __assert_fail("!Abc_LitIsCompl(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                        ,0x3f4,
                        "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                       );
        }
        if ((uVar10 & 1) == 0) {
          if (nWords < 1) {
LAB_0079f0d9:
            uVar5 = 0;
          }
          else {
            uVar8 = 0;
            uVar5 = 0;
            do {
              uVar14 = (*(ulong *)((long)pvVar2 + uVar8 * 8) ^ *(ulong *)((long)pvVar1 + uVar8 * 8))
                       & pOn[uVar8];
              uVar14 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
              uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
              uVar14 = (uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f;
              uVar14 = (uVar14 >> 8) + uVar14;
              lVar12 = (uVar14 >> 0x10) + uVar14;
              uVar5 = uVar5 + ((int)((ulong)lVar12 >> 0x20) + (int)lVar12 & 0xffU);
              uVar8 = uVar8 + 1;
            } while (uVar15 != uVar8);
          }
        }
        else {
          if (nWords < 1) goto LAB_0079f0d9;
          uVar8 = 0;
          uVar5 = 0;
          do {
            uVar14 = ~(*(ulong *)((long)pvVar1 + uVar8 * 8) ^ *(ulong *)((long)pvVar2 + uVar8 * 8))
                     & pOn[uVar8];
            uVar14 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
            uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
            uVar14 = (uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f;
            uVar14 = (uVar14 >> 8) + uVar14;
            lVar12 = (uVar14 >> 0x10) + uVar14;
            uVar5 = uVar5 + ((int)((ulong)lVar12 >> 0x20) + (int)lVar12 & 0xffU);
            uVar8 = uVar8 + 1;
          } while (uVar15 != uVar8);
        }
      }
      iVar9 = vSorter->nSize;
      if (iVar9 <= (int)uVar5) {
        iVar17 = uVar5 + 1;
        iVar21 = iVar9 * 2;
        if (iVar9 * 2 <= iVar17) {
          iVar21 = iVar17;
        }
        iVar9 = vSorter->nCap;
        if (iVar9 < iVar21) {
          if (vSorter->pArray == (Vec_Int_t *)0x0) {
            pVVar6 = (Vec_Int_t *)malloc((long)iVar21 << 4);
          }
          else {
            pVVar6 = (Vec_Int_t *)realloc(vSorter->pArray,(long)iVar21 << 4);
            iVar9 = vSorter->nCap;
          }
          vSorter->pArray = pVVar6;
          memset(pVVar6 + iVar9,0,(long)(iVar21 - iVar9) << 4);
          vSorter->nCap = iVar21;
        }
        vSorter->nSize = iVar17;
        iVar9 = iVar17;
      }
      if (((int)uVar5 < 0) || (iVar9 <= (int)uVar5)) goto LAB_0079f36e;
      Vec_IntPush(vSorter->pArray + uVar5,uVar10);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vUnatePairs->nSize);
    uVar10 = vSorter->nSize;
  }
  vUnatePairs->nSize = 0;
  vUnatePairsW->nSize = 0;
  if (0 < (int)uVar10) {
    uVar15 = (ulong)uVar10;
    do {
      if ((long)vSorter->nSize < (long)uVar15) {
LAB_0079f36e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      uVar8 = uVar15 - 1;
      pVVar6 = vSorter->pArray;
      if (0 < pVVar6[uVar8].nSize) {
        lVar7 = 0;
        do {
          Vec_IntPush(vUnatePairs,pVVar6[uVar8].pArray[lVar7]);
          Vec_IntPush(vUnatePairsW,(int)uVar8);
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar6[uVar8].nSize);
      }
      auVar4 = _DAT_0093d220;
      bVar3 = 1 < (long)uVar15;
      uVar15 = uVar8;
    } while (bVar3);
    iVar9 = vSorter->nSize;
    if (0 < (long)iVar9) {
      pVVar6 = vSorter->pArray;
      lVar7 = (long)iVar9 + -1;
      auVar16._8_4_ = (int)lVar7;
      auVar16._0_8_ = lVar7;
      auVar16._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar16 = auVar16 ^ _DAT_0093d220;
      auVar18 = _DAT_0093e4e0;
      auVar19 = _DAT_0093d210;
      do {
        auVar20 = auVar19 ^ auVar4;
        iVar17 = auVar16._4_4_;
        if ((bool)(~(auVar20._4_4_ == iVar17 && auVar16._0_4_ < auVar20._0_4_ ||
                    iVar17 < auVar20._4_4_) & 1)) {
          *(undefined4 *)((long)&pVVar6->nSize + lVar7) = 0;
        }
        if ((auVar20._12_4_ != auVar16._12_4_ || auVar20._8_4_ <= auVar16._8_4_) &&
            auVar20._12_4_ <= auVar16._12_4_) {
          *(undefined4 *)((long)&pVVar6[1].nSize + lVar7) = 0;
        }
        auVar20 = auVar18 ^ auVar4;
        iVar21 = auVar20._4_4_;
        if (iVar21 <= iVar17 && (iVar21 != iVar17 || auVar20._0_4_ <= auVar16._0_4_)) {
          *(undefined4 *)((long)&pVVar6[2].nSize + lVar7) = 0;
          *(undefined4 *)((long)&pVVar6[3].nSize + lVar7) = 0;
        }
        lVar12 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 4;
        auVar19._8_8_ = lVar12 + 4;
        lVar12 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 4;
        auVar18._8_8_ = lVar12 + 4;
        lVar7 = lVar7 + 0x40;
      } while ((ulong)(iVar9 + 3U >> 2) << 6 != lVar7);
    }
  }
  vSorter->nSize = 0;
  return;
}

Assistant:

void Gia_ManSortPairsInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnatePairsW, Vec_Wec_t * vSorter )
{
    int i, k, iPair;
    Vec_Int_t * vLevel;
    Vec_WecInit( vSorter, nWords*64 );
    Vec_IntForEachEntry( vUnatePairs, iPair, i )
    {
        int fComp = Abc_LitIsCompl(iPair);
        int iLit0 = Abc_Lit2Var(iPair) & 0x7FFF;
        int iLit1 = Abc_Lit2Var(iPair) >> 15;
        word * pDiv0 = (word *)Vec_PtrEntry( vDivs, Abc_Lit2Var(iLit0) );
        word * pDiv1 = (word *)Vec_PtrEntry( vDivs, Abc_Lit2Var(iLit1) );
        if ( iLit0 < iLit1 )
        {
            assert( !fComp );
            //assert( !Abc_TtIntersectTwo( pOff, 0, pDiv0, Abc_LitIsCompl(iLit0), pDiv1, Abc_LitIsCompl(iLit1), nWords ) );
            Vec_WecPush( vSorter, Abc_TtCountOnesVecMask2(pDiv0, pDiv1, Abc_LitIsCompl(iLit0), Abc_LitIsCompl(iLit1), pOn, nWords), iPair );
        }
        else
        {
            assert( !Abc_LitIsCompl(iLit0) );
            assert( !Abc_LitIsCompl(iLit1) );
            //assert( !Abc_TtIntersectXor( pOff, 0, pDiv0, pDiv1, fComp, nWords ) );
            Vec_WecPush( vSorter, Abc_TtCountOnesVecXorMask(pDiv0, pDiv1, fComp, pOn, nWords), iPair );
        }
    }
    Vec_IntClear( vUnatePairs );
    Vec_IntClear( vUnatePairsW );
    Vec_WecForEachLevelReverse( vSorter, vLevel, k )
        Vec_IntForEachEntry( vLevel, iPair, i )
        {
            Vec_IntPush( vUnatePairs, iPair );
            Vec_IntPush( vUnatePairsW, k );
        }
    //Vec_IntPrint( Vec_WecEntry(vSorter, 0) );
    Vec_WecClear( vSorter );

}